

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_remove_if.c
# Opt level: O0

void linkedlist_remove_if
               (s_linkedlist *linked_list,f_matcher matcher,void *matcher_arg,
               f_destroy_element destroy_element)

{
  s_linkedlist_node *psVar1;
  e_matcher_result eVar2;
  s_linkedlist_node *to_delete;
  s_linkedlist_node *node;
  f_destroy_element destroy_element_local;
  void *matcher_arg_local;
  f_matcher matcher_local;
  s_linkedlist *linked_list_local;
  
  to_delete = linked_list->head;
  while (to_delete != (s_linkedlist_node *)0x0) {
    eVar2 = (*matcher)(to_delete->element,matcher_arg);
    if (eVar2 == E_MATCHER_RESULT_MATCH) {
      if (to_delete->previous == (s_linkedlist_node *)0x0) {
        linked_list->head = to_delete->next;
      }
      else {
        to_delete->previous->next = to_delete->next;
      }
      if (to_delete->next == (s_linkedlist_node *)0x0) {
        linked_list->tail = to_delete->previous;
      }
      else {
        to_delete->next->previous = to_delete->previous;
      }
      psVar1 = to_delete->next;
      if (destroy_element != (f_destroy_element)0x0) {
        (*destroy_element)(psVar1->element);
      }
      free(to_delete);
      linked_list->size = linked_list->size - 1;
      to_delete = psVar1;
    }
    else {
      to_delete = to_delete->next;
    }
  }
  return;
}

Assistant:

void
linkedlist_remove_if(s_linkedlist *linked_list, f_matcher matcher, void *matcher_arg, f_destroy_element destroy_element) {
    s_linkedlist_node *node      = linked_list->head;
    s_linkedlist_node *to_delete = NULL;

    while (node != NULL) {
        if (matcher(node->element, matcher_arg) == E_MATCHER_RESULT_MATCH) {
            if (node->previous == NULL) {
                linked_list->head = node->next;
            } else {
                node->previous->next = node->next;
            }

            if (node->next == NULL) {
                linked_list->tail = node->previous;
            } else {
                node->next->previous = node->previous;
            }

            to_delete = node;
            node      = to_delete->next;

            if (destroy_element != NULL) {
                destroy_element(node->element);
            }

            free(to_delete);
            linked_list->size -= 1;
        } else {
            node = node->next;
        }
    }
}